

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_process_sod(jpc_dec_t *dec,jpc_ms_t *ms)

{
  byte bVar1;
  jpc_dec_tile_t *tile;
  jpc_streamlist_t *pjVar2;
  jpc_ppxstab_t *pjVar3;
  jpc_ppxstabent_t *pjVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  FILE *__stream;
  int iVar8;
  int iVar9;
  jas_stream_t *pjVar10;
  jpc_dec_cp_t *pjVar11;
  jpc_dec_rlvl_t *pjVar12;
  jpc_dec_band_t **ppjVar13;
  jas_matrix_t *pjVar14;
  jpc_tsfb_t *tsfb;
  jpc_dec_band_t *pjVar15;
  jpc_dec_prc_t *pjVar16;
  jpc_tagtree_t *pjVar17;
  uint_fast16_t uVar18;
  jpc_pi_t *pi;
  jpc_pchg_t *pjVar19;
  byte bVar20;
  jpc_dec_ccp_t *pjVar21;
  size_t num_elements;
  int iVar22;
  uint_fast16_t *puVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  jpc_dec_tile_t *pjVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  jpc_dec_tcomp_t *pjVar37;
  ulong uVar38;
  ulong xend;
  jpc_pchglist_t *pchglist;
  uint uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong local_1378;
  ulong local_1360;
  ulong local_1358;
  ulong local_1350;
  jpc_dec_cmpt_t *local_1348;
  jpc_dec_cblk_t *local_1328;
  jpc_tsfb_band_t local_12f8 [100];
  
  tile = dec->curtile;
  if (tile == (jpc_dec_tile_t *)0x0) {
    return -1;
  }
  if (tile->partno == 0) {
    pjVar11 = tile->cp;
    if ((~pjVar11->flags & 3U) != 0) {
      return -1;
    }
    lVar26 = (long)pjVar11->numcomps;
    if (lVar26 != 0) {
      puVar23 = &pjVar11->ccps->numstepsizes;
      do {
        if (*(uint_fast8_t *)((long)puVar23 + -7) == '\x01') {
          if (*puVar23 != 1) {
            return -1;
          }
        }
        else if ((int)*puVar23 <
                 (int)((uint)*(uint_fast8_t *)((long)puVar23 + -0xb) +
                       (uint)*(uint_fast8_t *)((long)puVar23 + -0xb) * 2 + -2)) {
          return -1;
        }
        puVar23 = puVar23 + 0x70;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
      if (0 < pjVar11->numcomps) {
        pjVar21 = pjVar11->ccps;
        iVar8 = 0;
        do {
          if ((pjVar21->csty & 1) == 0) {
            lVar26 = 0x33b;
            do {
              *(undefined1 *)((long)pjVar21->stepsizes + lVar26 + -0x18) = 0xf;
              *(undefined1 *)((long)pjVar21->stepsizes + lVar26 + 9) = 0xf;
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0x35c);
          }
          if ((pjVar21->qsty == '\x01') && (bVar20 = pjVar21->numrlvls, bVar20 != 0)) {
            uVar28 = pjVar21->stepsizes[0];
            uVar34 = 0;
            do {
              uVar39 = ((int)uVar34 + 2U) / 3 + ((uint)(uVar28 >> 0xb) & 0x1fffff);
              if (0x1f < uVar39) {
                return -1;
              }
              pjVar21->stepsizes[uVar34] = (ulong)(uVar39 * 0x800 | (uint)uVar28 & 0x7ff);
              uVar34 = uVar34 + 1;
            } while (((uint)bVar20 + (uint)bVar20 * 2) - 2 != uVar34);
          }
          iVar8 = iVar8 + 1;
          pjVar21 = pjVar21 + 1;
        } while (iVar8 < pjVar11->numcomps);
        pjVar11 = tile->cp;
      }
    }
    tile->realmode = (uint)(pjVar11->mctid == '\x01');
    if (0 < dec->numcomps) {
      local_1348 = dec->cmpts;
      pjVar37 = tile->tcomps;
      lVar26 = 0;
      do {
        pjVar21 = tile->cp->ccps;
        if (pjVar21[lVar26].qmfbid == '\0') {
          tile->realmode = 1;
        }
        bVar20 = pjVar21[lVar26].numrlvls;
        pjVar37->numrlvls = (uint)bVar20;
        pjVar12 = (jpc_dec_rlvl_t *)jas_alloc2((ulong)bVar20,0x60);
        pjVar37->rlvls = pjVar12;
        auVar7 = _DAT_00139d70;
        auVar6 = _DAT_001384e0;
        if (pjVar12 == (jpc_dec_rlvl_t *)0x0) {
          return -1;
        }
        uVar28 = (ulong)pjVar37->numrlvls;
        if (uVar28 != 0) {
          lVar36 = uVar28 - 1;
          auVar41._8_4_ = (int)lVar36;
          auVar41._0_8_ = lVar36;
          auVar41._12_4_ = (int)((ulong)lVar36 >> 0x20);
          ppjVar13 = &pjVar12->bands;
          auVar41 = auVar41 ^ _DAT_001384e0;
          uVar34 = 0;
          do {
            auVar42._8_4_ = (int)uVar34;
            auVar42._0_8_ = uVar34;
            auVar42._12_4_ = (int)(uVar34 >> 0x20);
            auVar42 = (auVar42 | auVar7) ^ auVar6;
            if ((bool)(~(auVar41._4_4_ < auVar42._4_4_ ||
                        auVar41._0_4_ < auVar42._0_4_ && auVar42._4_4_ == auVar41._4_4_) & 1)) {
              *ppjVar13 = (jpc_dec_band_t *)0x0;
            }
            if (auVar42._12_4_ <= auVar41._12_4_ &&
                (auVar42._8_4_ <= auVar41._8_4_ || auVar42._12_4_ != auVar41._12_4_)) {
              ppjVar13[0xc] = (jpc_dec_band_t *)0x0;
            }
            uVar34 = uVar34 + 2;
            ppjVar13 = ppjVar13 + 0x18;
          } while ((uVar28 + 1 & 0xfffffffffffffffe) != uVar34);
        }
        uVar28 = local_1348->hstep;
        uVar34 = local_1348->vstep;
        pjVar14 = jas_seq2d_create((tile->xstart + (uVar28 - 1)) / uVar28,
                                   (tile->ystart + (uVar34 - 1)) / uVar34,
                                   ((uVar28 - 1) + tile->xend) / uVar28,
                                   ((uVar34 - 1) + tile->yend) / uVar34);
        pjVar37->data = pjVar14;
        if (pjVar14 == (jas_matrix_t *)0x0) {
          return -1;
        }
        tsfb = jpc_cod_gettsfb((uint)pjVar21[lVar26].qmfbid,pjVar37->numrlvls - 1);
        pjVar37->tsfb = tsfb;
        if (tsfb == (jpc_tsfb_t *)0x0) {
          return -1;
        }
        pjVar14 = pjVar37->data;
        jpc_tsfb_getbands(tsfb,pjVar14->xstart_,pjVar14->ystart_,pjVar14->xend_,pjVar14->yend_,
                          local_12f8);
        uVar28 = (ulong)pjVar37->numrlvls;
        if (pjVar37->numrlvls != 0) {
          pjVar12 = pjVar37->rlvls;
          uVar34 = 0;
          do {
            pjVar12->bands = (jpc_dec_band_t *)0x0;
            bVar20 = ~(byte)uVar34 + (char)uVar28;
            lVar36 = (long)(1 << (bVar20 & 0x1f)) + -1;
            uVar30 = pjVar37->xstart + lVar36 >> (bVar20 & 0x3f);
            pjVar12->xstart = uVar30;
            uVar31 = pjVar37->ystart + lVar36 >> (bVar20 & 0x3f);
            pjVar12->ystart = uVar31;
            uVar32 = pjVar37->xend + lVar36 >> (bVar20 & 0x3f);
            pjVar12->xend = uVar32;
            uVar28 = lVar36 + pjVar37->yend >> (bVar20 & 0x3f);
            pjVar12->yend = uVar28;
            bVar20 = pjVar21[lVar26].prcwidthexpns[uVar34];
            uVar24 = (uint)bVar20;
            pjVar12->prcwidthexpn = (uint)bVar20;
            bVar1 = pjVar21[lVar26].prcheightexpns[uVar34];
            uVar39 = (uint)bVar1;
            local_1378 = -1L << (bVar20 & 0x3f);
            uVar38 = -1L << (bVar1 & 0x3f);
            pjVar12->prcheightexpn = (uint)bVar1;
            local_1350 = (uVar32 + (long)(1 << (bVar20 & 0x1f))) - 1 & local_1378;
            local_1378 = local_1378 & uVar30;
            local_1360 = uVar38 & uVar31;
            iVar9 = (int)(local_1350 - local_1378 >> (bVar20 & 0x3f));
            pjVar12->numhprcs = iVar9;
            iVar8 = (int)(((uVar28 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar38) - local_1360 >>
                         (bVar1 & 0x3f));
            pjVar12->numvprcs = iVar8;
            iVar8 = iVar8 * iVar9;
            pjVar12->numprcs = iVar8;
            if (0xffff < iVar8) {
              return -1;
            }
            if ((uVar30 < uVar32) && (uVar31 < uVar28)) {
              if (uVar34 == 0) {
                pjVar12->cbgwidthexpn = (uint)bVar20;
                pjVar12->cbgheightexpn = (uint)bVar1;
                num_elements = 1;
              }
              else {
                uVar24 = bVar20 - 1;
                pjVar12->cbgwidthexpn = uVar24;
                uVar39 = bVar1 - 1;
                pjVar12->cbgheightexpn = uVar39;
                if (bVar20 == 0) {
                  return -1;
                }
                if (bVar1 == 0) {
                  return -1;
                }
                local_1350 = local_1350 + 1 >> 1;
                local_1360 = local_1360 + 1 >> 1;
                local_1378 = local_1378 + 1 >> 1;
                num_elements = 3;
              }
              uVar25 = (uint)pjVar21[lVar26].cblkwidthexpn;
              if ((int)uVar24 < (int)(uint)pjVar21[lVar26].cblkwidthexpn) {
                uVar25 = uVar24;
              }
              pjVar12->cblkwidthexpn = (long)(int)uVar25;
              uVar24 = (uint)pjVar21[lVar26].cblkheightexpn;
              if ((int)uVar39 < (int)(uint)pjVar21[lVar26].cblkheightexpn) {
                uVar24 = uVar39;
              }
              pjVar12->cblkheightexpn = (long)(int)uVar24;
              pjVar12->numbands = (int)num_elements;
              pjVar15 = (jpc_dec_band_t *)jas_alloc2(num_elements,0x30);
              pjVar12->bands = pjVar15;
              if (pjVar15 == (jpc_dec_band_t *)0x0) {
                return -1;
              }
              if (0 < pjVar12->numbands) {
                iVar8 = 0;
                do {
                  lVar36 = (long)((int)uVar34 * 3 + -2 + iVar8);
                  if (uVar34 == 0) {
                    lVar36 = 0;
                  }
                  iVar9 = local_12f8[lVar36].orient;
                  pjVar15->orient = iVar9;
                  uVar39 = (uint)pjVar21[lVar26].stepsizes[lVar36];
                  pjVar15->stepsize = uVar39;
                  iVar9 = JPC_NOMINALGAIN((uint)pjVar21[lVar26].qmfbid,pjVar37->numrlvls - 1,
                                          (int)uVar34,iVar9);
                  pjVar15->analgain = iVar9;
                  uVar28 = (ulong)(uVar39 & 0x7ff) * 4 + 0x2000;
                  uVar39 = uVar39 >> 0xb;
                  iVar9 = (iVar9 - uVar39) + (int)local_1348->prec;
                  bVar20 = (byte)iVar9;
                  uVar30 = uVar28 >> (-bVar20 & 0x3f);
                  if (-1 < iVar9) {
                    uVar30 = uVar28 << (bVar20 & 0x3f);
                  }
                  pjVar15->absstepsize = uVar30;
                  iVar9 = uVar39 + pjVar21[lVar26].numguardbits;
                  pjVar15->numbps = pjVar21[lVar26].numguardbits + uVar39 + -1;
                  uVar39 = 0x20 - iVar9;
                  if ((int)((uint)pjVar21[lVar26].roishift + iVar9 + -1) < 0x20) {
                    uVar39 = (uint)pjVar21[lVar26].roishift;
                  }
                  pjVar15->roishift = uVar39;
                  pjVar15->prcs = (jpc_dec_prc_t *)0x0;
                  pjVar15->data = (jas_matrix_t *)0x0;
                  if ((local_12f8[lVar36].xstart != local_12f8[lVar36].xend) &&
                     (local_12f8[lVar36].ystart != local_12f8[lVar36].yend)) {
                    pjVar14 = jas_seq2d_create(0,0,0,0);
                    pjVar15->data = pjVar14;
                    if (pjVar14 == (jas_matrix_t *)0x0) {
                      return -1;
                    }
                    iVar9 = jas_seq2d_bindsub(pjVar14,pjVar37->data,
                                              (long)local_12f8[lVar36].locxstart,
                                              (long)local_12f8[lVar36].locystart,
                                              (long)local_12f8[lVar36].locxend,
                                              (long)local_12f8[lVar36].locyend);
                    if (iVar9 != 0) {
                      return -1;
                    }
                    pjVar14 = pjVar15->data;
                    iVar9 = local_12f8[lVar36].xstart;
                    iVar22 = local_12f8[lVar36].ystart;
                    pjVar14->xstart_ = (long)iVar9;
                    pjVar14->ystart_ = (long)iVar22;
                    pjVar14->xend_ = (long)iVar9 + pjVar14->numcols_;
                    pjVar14->yend_ = (long)iVar22 + pjVar14->numrows_;
                    if ((long)pjVar12->numprcs == 0) {
                      __assert_fail("rlvl->numprcs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                    ,0x35b,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
                    }
                    pjVar16 = (jpc_dec_prc_t *)jas_alloc2((long)pjVar12->numprcs,0x48);
                    pjVar15->prcs = pjVar16;
                    if (pjVar16 == (jpc_dec_prc_t *)0x0) {
                      return -1;
                    }
                    if (0 < pjVar12->numprcs) {
                      iVar9 = pjVar12->cbgwidthexpn;
                      local_1358 = local_1360;
                      uVar28 = local_1378;
                      iVar22 = pjVar12->numprcs;
                      do {
                        uVar32 = (long)(1 << ((byte)iVar9 & 0x1f)) + uVar28;
                        uVar30 = (long)(1 << ((byte)pjVar12->cbgheightexpn & 0x1f)) + local_1358;
                        pjVar14 = pjVar15->data;
                        uVar31 = pjVar14->xstart_;
                        if ((ulong)pjVar14->xstart_ < uVar28) {
                          uVar31 = uVar28;
                        }
                        pjVar16->xstart = uVar31;
                        uVar38 = pjVar14->ystart_;
                        if ((ulong)pjVar14->ystart_ < local_1358) {
                          uVar38 = local_1358;
                        }
                        pjVar16->ystart = uVar38;
                        uVar40 = pjVar14->xend_;
                        if (uVar32 < (ulong)pjVar14->xend_) {
                          uVar40 = uVar32;
                        }
                        pjVar16->xend = uVar40;
                        if ((ulong)pjVar14->yend_ <= uVar30) {
                          uVar30 = pjVar14->yend_;
                        }
                        pjVar16->yend = uVar30;
                        if ((uVar31 < uVar40) && (uVar38 < uVar30)) {
                          bVar20 = (byte)pjVar12->cblkwidthexpn;
                          uVar35 = -1L << (bVar20 & 0x3f);
                          bVar1 = (byte)pjVar12->cblkheightexpn;
                          uVar33 = -1L << (bVar1 & 0x3f);
                          iVar29 = (int)(((uVar40 + (long)(1 << (bVar20 & 0x1f))) - 1 & uVar35) -
                                         (uVar31 & uVar35) >> (bVar20 & 0x3f));
                          pjVar16->numhcblks = iVar29;
                          iVar9 = (int)(((uVar30 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar33) -
                                        (uVar38 & uVar33) >> (bVar1 & 0x3f));
                          pjVar16->numvcblks = iVar9;
                          pjVar16->numcblks = iVar9 * iVar29;
                          if (iVar9 * iVar29 < 1) {
                            __assert_fail("prc->numcblks > 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                          ,0x37f,
                                          "int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
                          }
                          pjVar17 = jpc_tagtree_create(iVar29,iVar9);
                          pjVar16->incltagtree = pjVar17;
                          if (pjVar17 == (jpc_tagtree_t *)0x0) {
                            return -1;
                          }
                          pjVar17 = jpc_tagtree_create(pjVar16->numhcblks,pjVar16->numvcblks);
                          pjVar16->numimsbstagtree = pjVar17;
                          if (pjVar17 == (jpc_tagtree_t *)0x0) {
                            return -1;
                          }
                          local_1328 = (jpc_dec_cblk_t *)jas_alloc2((long)pjVar16->numcblks,0x50);
                          pjVar16->cblks = local_1328;
                          if (local_1328 == (jpc_dec_cblk_t *)0x0) {
                            return -1;
                          }
                          iVar9 = pjVar16->numcblks;
                          if (0 < iVar9) {
                            uVar18 = pjVar12->cblkwidthexpn;
                            uVar31 = local_1358;
                            uVar30 = uVar28;
                            do {
                              uVar33 = (long)(1 << ((byte)uVar18 & 0x1f)) + uVar30;
                              uVar40 = (long)(1 << ((byte)pjVar12->cblkheightexpn & 0x1f)) + uVar31;
                              uVar38 = pjVar16->xstart;
                              if (pjVar16->xstart < uVar30) {
                                uVar38 = uVar30;
                              }
                              uVar35 = pjVar16->ystart;
                              if (pjVar16->ystart < uVar31) {
                                uVar35 = uVar31;
                              }
                              xend = pjVar16->xend;
                              if (uVar33 < pjVar16->xend) {
                                xend = uVar33;
                              }
                              if (pjVar16->yend <= uVar40) {
                                uVar40 = pjVar16->yend;
                              }
                              if ((uVar38 < xend) && (uVar35 < uVar40)) {
                                local_1328->numpasses = 0;
                                (local_1328->segs).head = (jpc_dec_seg_t *)0x0;
                                (local_1328->segs).tail = (jpc_dec_seg_t *)0x0;
                                *(undefined1 (*) [16])((long)&(local_1328->segs).tail + 4) =
                                     (undefined1  [16])0x0;
                                local_1328->mqdec = (jpc_mqdec_t *)0x0;
                                local_1328->nulldec = (jpc_bitstream_t *)0x0;
                                local_1328->numlenbits = 3;
                                local_1328->firstpassno = -1;
                                local_1328->flags = (jas_matrix_t *)0x0;
                                pjVar14 = jas_seq2d_create(0,0,0,0);
                                local_1328->data = pjVar14;
                                if (pjVar14 == (jas_matrix_t *)0x0) {
                                  return -1;
                                }
                                iVar29 = jas_seq2d_bindsub(pjVar14,pjVar15->data,uVar38,uVar35,xend,
                                                           uVar40);
                                if (iVar29 != 0) {
                                  return -1;
                                }
                                local_1328 = local_1328 + 1;
                                uVar18 = pjVar12->cblkwidthexpn;
                                iVar9 = iVar9 + -1;
                                uVar33 = uVar30 + (long)(1 << ((byte)uVar18 & 0x1f));
                              }
                              uVar30 = uVar33;
                              if (uVar32 <= uVar33) {
                                uVar31 = uVar31 + (long)(1 << ((byte)pjVar12->cblkheightexpn & 0x1f)
                                                        );
                                uVar30 = uVar28;
                              }
                            } while (0 < iVar9);
                          }
                        }
                        else {
                          pjVar16->cblks = (jpc_dec_cblk_t *)0x0;
                          pjVar16->incltagtree = (jpc_tagtree_t *)0x0;
                          pjVar16->numimsbstagtree = (jpc_tagtree_t *)0x0;
                        }
                        iVar9 = pjVar12->cbgwidthexpn;
                        uVar28 = uVar28 + (long)(1 << ((byte)iVar9 & 0x1f));
                        if (local_1350 <= uVar28) {
                          local_1358 = local_1358 +
                                       (long)(1 << ((byte)pjVar12->cbgheightexpn & 0x1f));
                          uVar28 = local_1378;
                        }
                        pjVar16 = pjVar16 + 1;
                        bVar5 = 1 < iVar22;
                        iVar22 = iVar22 + -1;
                      } while (bVar5);
                    }
                  }
                  iVar8 = iVar8 + 1;
                  pjVar15 = pjVar15 + 1;
                } while (iVar8 < pjVar12->numbands);
              }
            }
            else {
              pjVar12->bands = (jpc_dec_band_t *)0x0;
              pjVar12->numprcs = 0;
              pjVar12->numhprcs = 0;
              pjVar12->numvprcs = 0;
            }
            uVar34 = uVar34 + 1;
            pjVar12 = pjVar12 + 1;
            uVar28 = (ulong)pjVar37->numrlvls;
          } while (uVar34 < uVar28);
        }
        lVar26 = lVar26 + 1;
        pjVar37 = pjVar37 + 1;
        local_1348 = local_1348 + 1;
      } while (lVar26 < dec->numcomps);
    }
    pi = jpc_dec_pi_create(dec,tile);
    tile->pi = pi;
    if (pi == (jpc_pi_t *)0x0) {
      return -1;
    }
    pchglist = tile->cp->pchglist;
    iVar8 = jpc_pchglist_numpchgs(pchglist);
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        pjVar19 = jpc_pchglist_get(pchglist,iVar8);
        pjVar19 = jpc_pchg_copy(pjVar19);
        if (pjVar19 == (jpc_pchg_t *)0x0) {
          __assert_fail("pchg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                        ,0x3ce,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
        }
        jpc_pi_addpchg(tile->pi,pjVar19);
        iVar8 = iVar8 + 1;
        pchglist = tile->cp->pchglist;
        iVar9 = jpc_pchglist_numpchgs(pchglist);
      } while (iVar8 < iVar9);
      pi = tile->pi;
    }
    jpc_pi_init(pi);
  }
  pjVar2 = dec->pkthdrstreams;
  if (pjVar2 != (jpc_streamlist_t *)0x0) {
    iVar8 = pjVar2->numstreams;
    if ((long)iVar8 < 1) {
      abort();
    }
    pjVar10 = *pjVar2->streams;
    if (iVar8 != 1) {
      lVar26 = 1;
      do {
        pjVar2->streams[lVar26 + -1] = pjVar2->streams[lVar26];
        lVar26 = lVar26 + 1;
      } while (iVar8 != lVar26);
    }
    pjVar2->numstreams = iVar8 + -1;
    tile->pkthdrstream = pjVar10;
    if (pjVar10 == (jas_stream_t *)0x0) {
      return -1;
    }
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    pjVar10 = tile->pkthdrstream;
    if (pjVar10 == (jas_stream_t *)0x0) {
      pjVar10 = jas_stream_memopen((char *)0x0,0);
      tile->pkthdrstream = pjVar10;
      if (pjVar10 == (jas_stream_t *)0x0) {
        return -1;
      }
    }
    lVar26 = jas_stream_tell(pjVar10);
    jas_stream_seek(pjVar10,0,2);
    pjVar3 = tile->pptstab;
    pjVar10 = tile->pkthdrstream;
    if (0 < pjVar3->numents) {
      lVar36 = 0;
      do {
        pjVar4 = pjVar3->ents[lVar36];
        iVar8 = jas_stream_write(pjVar10,pjVar4->data,(uint)pjVar4->len);
        if (iVar8 != (int)pjVar4->len) {
          return -1;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 < pjVar3->numents);
      pjVar10 = tile->pkthdrstream;
    }
    jas_stream_seek(pjVar10,(long)(int)lVar26,0);
    jpc_ppxstab_destroy(tile->pptstab);
    tile->pptstab = (jpc_ppxstab_t *)0x0;
  }
  iVar8 = jas_getdbglevel();
  __stream = _stderr;
  if ((9 < iVar8) && (iVar8 = dec->numtiles, iVar8 != 0)) {
    pjVar27 = dec->tiles;
    if (pjVar27 == (jpc_dec_tile_t *)0x0) {
      __assert_fail("!dec->numtiles || dec->tiles",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                    ,0x887,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
    }
    if (0 < iVar8) {
      iVar9 = dec->numcomps;
      iVar29 = 0;
      iVar22 = iVar9;
      do {
        if (iVar22 == 0) {
          iVar22 = 0;
        }
        else {
          pjVar37 = pjVar27->tcomps;
          if (pjVar37 == (jpc_dec_tcomp_t *)0x0) {
            __assert_fail("!dec->numcomps || tile->tcomps",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                          ,0x88a,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
          }
          if (0 < iVar22) {
            iVar8 = 0;
            do {
              if (pjVar37->numrlvls != 0) {
                pjVar12 = pjVar37->rlvls;
                uVar28 = 0;
                do {
                  fprintf(__stream,"RESOLUTION LEVEL %d\n",uVar28);
                  fprintf(__stream,"xs = %lu, ys = %lu, xe = %lu, ye = %lu, w = %lu, h = %lu\n");
                  if (pjVar12->numbands != 0) {
                    if (pjVar12->bands == (jpc_dec_band_t *)0x0) {
                      __assert_fail("!rlvl->numbands || rlvl->bands",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                    ,0x893,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
                    }
                    if (0 < pjVar12->numbands) {
                      jpc_dec_process_sod_cold_1();
                    }
                  }
                  uVar39 = (int)uVar28 + 1;
                  uVar28 = (ulong)uVar39;
                  pjVar12 = pjVar12 + 1;
                } while (uVar39 < pjVar37->numrlvls);
                iVar9 = dec->numcomps;
              }
              iVar8 = iVar8 + 1;
              pjVar37 = pjVar37 + 1;
            } while (iVar8 < iVar9);
            iVar8 = dec->numtiles;
            iVar22 = iVar9;
          }
        }
        iVar29 = iVar29 + 1;
        pjVar27 = pjVar27 + 1;
      } while (iVar29 < iVar8);
    }
  }
  pjVar10 = tile->pkthdrstream;
  if (tile->pkthdrstream == (jas_stream_t *)0x0) {
    pjVar10 = dec->in;
  }
  iVar8 = jpc_dec_decodepkts(dec,pjVar10,dec->in);
  if (iVar8 != 0) {
    jas_eprintf("jpc_dec_decodepkts failed\n");
    return -1;
  }
  uVar28 = dec->curtileendoff;
  if (0 < (long)uVar28) {
    uVar34 = dec->in->rwcnt_;
    lVar26 = uVar34 - uVar28;
    if ((long)uVar34 < (long)uVar28) {
      jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",uVar28 - uVar34);
      do {
        pjVar10 = dec->in;
        if ((pjVar10->flags_ & 7U) != 0) {
LAB_0011cf67:
          jas_eprintf("read error\n");
          return -1;
        }
        if ((-1 < pjVar10->rwlimit_) && (pjVar10->rwlimit_ <= pjVar10->rwcnt_)) {
          pjVar10->flags_ = pjVar10->flags_ | 4;
          goto LAB_0011cf67;
        }
        iVar8 = pjVar10->cnt_;
        pjVar10->cnt_ = iVar8 + -1;
        if (iVar8 < 1) {
          iVar8 = jas_stream_fillbuf(pjVar10,1);
          if (iVar8 == -1) goto LAB_0011cf67;
        }
        else {
          pjVar10->rwcnt_ = pjVar10->rwcnt_ + 1;
          pjVar10->ptr_ = pjVar10->ptr_ + 1;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0);
    }
    else if (uVar28 <= uVar34 && lVar26 != 0) {
      jas_eprintf("warning: not enough tile data (%lu bytes)\n",lVar26);
    }
  }
  iVar8 = tile->partno;
  if (iVar8 == tile->numparts + -1 && 0 < tile->numparts) {
    iVar8 = jpc_dec_tiledecode(dec,tile);
    if (iVar8 != 0) {
      return -1;
    }
    jpc_dec_tilefini(dec,tile);
    iVar8 = tile->partno;
  }
  dec->curtile = (jpc_dec_tile_t *)0x0;
  tile->partno = iVar8 + 1;
  dec->state = 8;
  return 0;
}

Assistant:

static int jpc_dec_process_sod(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	int pos;

	/* Eliminate compiler warnings about unused variables. */
	(void)ms;

	if (!(tile = dec->curtile)) {
		return -1;
	}

	if (!tile->partno) {
		if (!jpc_dec_cp_isvalid(tile->cp)) {
			return -1;
		}
		if (jpc_dec_cp_prepare(tile->cp)) {
			return -1;
		}
		if (jpc_dec_tileinit(dec, tile)) {
			return -1;
		}
	}

	/* Are packet headers stored in the main header or tile-part header? */
	if (dec->pkthdrstreams) {
		/* Get the stream containing the packet header data for this
		  tile-part. */
		if (!(tile->pkthdrstream = jpc_streamlist_remove(dec->pkthdrstreams, 0))) {
			return -1;
		}
	}

	if (tile->pptstab) {
		if (!tile->pkthdrstream) {
			if (!(tile->pkthdrstream = jas_stream_memopen(0, 0))) {
				return -1;
			}
		}
		pos = jas_stream_tell(tile->pkthdrstream);
		jas_stream_seek(tile->pkthdrstream, 0, SEEK_END);
		if (jpc_pptstabwrite(tile->pkthdrstream, tile->pptstab)) {
			return -1;
		}
		jas_stream_seek(tile->pkthdrstream, pos, SEEK_SET);
		jpc_ppxstab_destroy(tile->pptstab);
		tile->pptstab = 0;
	}

	if (jas_getdbglevel() >= 10) {
		jpc_dec_dump(dec, stderr);
	}

	if (jpc_dec_decodepkts(dec, (tile->pkthdrstream) ? tile->pkthdrstream :
	  dec->in, dec->in)) {
		jas_eprintf("jpc_dec_decodepkts failed\n");
		return -1;
	}

	/* Gobble any unconsumed tile data. */
	if (dec->curtileendoff > 0) {
		long curoff;
		uint_fast32_t n;
		curoff = jas_stream_getrwcount(dec->in);
		if (curoff < dec->curtileendoff) {
			n = dec->curtileendoff - curoff;
			jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",
			  (unsigned long) n);

			while (n-- > 0) {
				if (jas_stream_getc(dec->in) == EOF) {
					jas_eprintf("read error\n");
					return -1;
				}
			}
		} else if (curoff > dec->curtileendoff) {
			jas_eprintf("warning: not enough tile data (%lu bytes)\n",
			  (unsigned long) curoff - dec->curtileendoff);
		}

	}

	if (tile->numparts > 0 && tile->partno == tile->numparts - 1) {
		if (jpc_dec_tiledecode(dec, tile)) {
			return -1;
		}
		jpc_dec_tilefini(dec, tile);
	}

	dec->curtile = 0;

	/* Increment the expected tile-part number. */
	++tile->partno;

	/* We should expect to encounter a SOT marker segment next. */
	dec->state = JPC_TPHSOT;

	return 0;
}